

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

int ZIP_seek(PHYSFS_Io *_io,PHYSFS_uint64 offset)

{
  ushort uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int window_bits;
  long lVar7;
  mz_stream *pmVar8;
  mz_streamp pmVar9;
  uint uVar10;
  byte bVar11;
  mz_stream str;
  
  bVar11 = 0;
  plVar2 = (long *)_io->opaque;
  lVar6 = *plVar2;
  if (*(ulong *)(lVar6 + 0x58) < offset) {
    PHYSFS_setErrorCode(PHYSFS_ERR_PAST_EOF);
  }
  else {
    lVar3 = plVar2[1];
    uVar1 = *(ushort *)(lVar6 + 0x44);
    window_bits = (int)offset;
    if (((uVar1 & 1) == 0) && (*(short *)(lVar6 + 0x46) == 0)) {
      iVar4 = (**(code **)(lVar3 + 0x20))(lVar3,*(long *)(lVar6 + 0x38) + offset);
      if (iVar4 != 0) {
        *(int *)((long)plVar2 + 0x14) = window_bits;
        return 1;
      }
    }
    else {
      if (offset < *(uint *)((long)plVar2 + 0x14)) {
        str.data_type = 0;
        str._92_4_ = 0;
        str.adler = 0;
        str.reserved = 0;
        str.msg = (char *)0x0;
        str.state = (mz_internal_state *)0x0;
        str.avail_out = 0;
        str._36_4_ = 0;
        str.total_out = 0;
        str.total_in = 0;
        str.next_out = (uchar *)0x0;
        str.next_in = (uchar *)0x0;
        str.avail_in = 0;
        str._12_4_ = 0;
        str.zalloc = zlibPhysfsAlloc;
        str.zfree = zlibPhysfsFree;
        str.opaque = &__PHYSFS_AllocatorHooks;
        iVar4 = mz_inflateInit2(&str,window_bits);
        zlib_err(iVar4);
        if (iVar4 != 0) {
          return 0;
        }
        lVar7 = 0xc;
        if ((uVar1 & 1) == 0) {
          lVar7 = 0;
        }
        iVar4 = (**(code **)(lVar3 + 0x20))(lVar3,lVar7 + *(long *)(lVar6 + 0x38));
        if (iVar4 == 0) {
          return 0;
        }
        mz_inflateEnd((mz_streamp)(plVar2 + 7));
        pmVar8 = &str;
        pmVar9 = (mz_streamp)(plVar2 + 7);
        for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
          pmVar9->next_in = pmVar8->next_in;
          pmVar8 = (mz_stream *)((long)pmVar8 + (ulong)bVar11 * -0x10 + 8);
          pmVar9 = (mz_streamp)((long)pmVar9 + (ulong)bVar11 * -0x10 + 8);
        }
        plVar2[2] = 0;
        if ((uVar1 & 1) != 0) {
          *(undefined4 *)(plVar2 + 5) = *(undefined4 *)((long)plVar2 + 0x34);
          plVar2[4] = *(long *)((long)plVar2 + 0x2c);
        }
      }
      do {
        if (*(uint *)((long)plVar2 + 0x14) == offset) {
          return 1;
        }
        uVar10 = window_bits - *(uint *)((long)plVar2 + 0x14);
        if (0x1ff < uVar10) {
          uVar10 = 0x200;
        }
        uVar5 = ZIP_read(_io,&str,(ulong)uVar10);
      } while (uVar5 == uVar10);
    }
  }
  return 0;
}

Assistant:

static int ZIP_seek(PHYSFS_Io *_io, PHYSFS_uint64 offset)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_Io *io = finfo->io;
    const int encrypted = zip_entry_is_tradional_crypto(entry);

    BAIL_IF(offset > entry->uncompressed_size, PHYSFS_ERR_PAST_EOF, 0);

    if (!encrypted && (entry->compression_method == COMPMETH_NONE))
    {
        PHYSFS_sint64 newpos = offset + entry->offset;
        BAIL_IF_ERRPASS(!io->seek(io, newpos), 0);
        finfo->uncompressed_position = (PHYSFS_uint32) offset;
    } /* if */

    else
    {
        /*
         * If seeking backwards, we need to redecode the file
         *  from the start and throw away the compressed bits until we hit
         *  the offset we need. If seeking forward, we still need to
         *  decode, but we don't rewind first.
         */
        if (offset < finfo->uncompressed_position)
        {
            /* we do a copy so state is sane if inflateInit2() fails. */
            z_stream str;
            initializeZStream(&str);
            if (zlib_err(inflateInit2(&str, -MAX_WBITS)) != Z_OK)
                return 0;

            if (!io->seek(io, entry->offset + (encrypted ? 12 : 0)))
                return 0;

            inflateEnd(&finfo->stream);
            memcpy(&finfo->stream, &str, sizeof (z_stream));
            finfo->uncompressed_position = finfo->compressed_position = 0;

            if (encrypted)
                memcpy(finfo->crypto_keys, finfo->initial_crypto_keys, 12);
        } /* if */

        while (finfo->uncompressed_position != offset)
        {
            PHYSFS_uint8 buf[512];
            PHYSFS_uint32 maxread;

            maxread = (PHYSFS_uint32) (offset - finfo->uncompressed_position);
            if (maxread > sizeof (buf))
                maxread = sizeof (buf);

            if (ZIP_read(_io, buf, maxread) != maxread)
                return 0;
        } /* while */
    } /* else */

    return 1;
}